

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

void __thiscall
xs::ExecuteBinaryMessage::ExecuteBinaryMessage
          (ExecuteBinaryMessage *this,deUint8 *data,size_t dataSize)

{
  undefined1 local_38 [8];
  MessageParser parser;
  size_t dataSize_local;
  deUint8 *data_local;
  ExecuteBinaryMessage *this_local;
  
  parser.m_pos = dataSize;
  Message::Message(&this->super_Message,MESSAGETYPE_EXECUTE_BINARY);
  (this->super_Message)._vptr_Message = (_func_int **)&PTR__ExecuteBinaryMessage_001b3888;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->params);
  std::__cxx11::string::string((string *)&this->workDir);
  std::__cxx11::string::string((string *)&this->caseList);
  MessageParser::MessageParser((MessageParser *)local_38,data,parser.m_pos);
  MessageParser::getString((MessageParser *)local_38,&this->name);
  MessageParser::getString((MessageParser *)local_38,&this->params);
  MessageParser::getString((MessageParser *)local_38,&this->workDir);
  MessageParser::getString((MessageParser *)local_38,&this->caseList);
  MessageParser::assumEnd((MessageParser *)local_38);
  return;
}

Assistant:

ExecuteBinaryMessage::ExecuteBinaryMessage (const deUint8* data, size_t dataSize)
	: Message(MESSAGETYPE_EXECUTE_BINARY)
{
	MessageParser parser(data, dataSize);
	parser.getString(name);
	parser.getString(params);
	parser.getString(workDir);
	parser.getString(caseList);
	parser.assumEnd();
}